

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInNetworks
          (Registry *this,StringArray *aAliases,StringArray *aUnresolved)

{
  pointer pbVar1;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  size_t __n_00;
  pointer pBVar4;
  pointer pNVar5;
  StringArray *pSVar6;
  Status SVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  pointer pNVar11;
  pointer pbVar12;
  long lVar13;
  pointer pNVar14;
  long lVar15;
  BorderRouter *br_1;
  pointer pBVar16;
  bool bVar17;
  BorderRouterArray brs;
  NetworkArray nwks;
  Network current;
  BorderRouter br;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  local_278;
  NetworkArray local_258;
  StringArray *local_240;
  StringArray *local_238;
  void *local_230;
  void *local_228;
  void *local_220;
  Network local_218;
  BorderRouter local_1b8;
  
  local_258.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = aUnresolved;
  Network::Network(&local_218);
  __n_00 = DAT_0028ed78;
  __n = DAT_0028ed58;
  sVar3 = DAT_0028ed38;
  pbVar12 = (aAliases->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (aAliases->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_240 = aAliases;
  if (pbVar12 != pbVar1) {
    local_220 = (anonymous_namespace)::ALIAS_THIS_abi_cxx11_;
    local_228 = (anonymous_namespace)::ALIAS_ALL_abi_cxx11_;
    local_230 = (anonymous_namespace)::ALIAS_OTHER_abi_cxx11_;
    uVar10 = (long)pbVar1 - (long)pbVar12;
    do {
      sVar2 = pbVar12->_M_string_length;
      if (((sVar2 == sVar3) &&
          ((SVar7 = kRestricted, sVar3 == 0 ||
           (iVar9 = bcmp((pbVar12->_M_dataplus)._M_p,local_220,sVar3), iVar9 == 0)))) ||
         ((sVar2 == __n &&
          ((SVar7 = kDataInvalid, __n == 0 ||
           (iVar9 = bcmp((pbVar12->_M_dataplus)._M_p,local_228,__n), iVar9 == 0))))))
      goto LAB_0017f181;
      if (sVar2 == __n_00) {
        if (__n_00 == 0) {
          if (0x20 < uVar10) goto LAB_0017f045;
        }
        else {
          iVar9 = bcmp((pbVar12->_M_dataplus)._M_p,local_230,__n_00);
          if (iVar9 == 0 && 0x20 < uVar10) {
LAB_0017f045:
            SVar7 = kDataInvalid;
            goto LAB_0017f181;
          }
        }
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar1);
  }
  pSVar6 = local_240;
  SVar7 = GetNetworksByAliases(this,local_240,&local_258,local_238);
  if (SVar7 != kSuccess) goto LAB_0017f181;
  pbVar12 = (pSVar6->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  sVar3 = pbVar12->_M_string_length;
  if (((sVar3 != DAT_0028ed78) ||
      ((sVar3 != 0 &&
       (iVar9 = bcmp((pbVar12->_M_dataplus)._M_p,(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_,sVar3
                    ), iVar9 != 0)))) &&
     (SVar7 = GetCurrentNetwork(this,&local_218), SVar7 != kSuccess)) goto LAB_0017f181;
  pNVar5 = local_258.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_218.mId.mId != 0xffffffff) {
    lVar13 = (long)local_258.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_258.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (lVar13 >> 5) * -0x5555555555555555 >> 2;
    pNVar11 = local_258.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < lVar15) {
      pNVar11 = local_258.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar15 * 4;
      lVar15 = lVar15 + 1;
      pNVar14 = local_258.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start + 2;
      do {
        if (pNVar14[-2].mId.mId == local_218.mId.mId) {
          pNVar14 = pNVar14 + -2;
          goto LAB_0017f060;
        }
        if (pNVar14[-1].mId.mId == local_218.mId.mId) {
          pNVar14 = pNVar14 + -1;
          goto LAB_0017f060;
        }
        if ((pNVar14->mId).mId == local_218.mId.mId) goto LAB_0017f060;
        if (pNVar14[1].mId.mId == local_218.mId.mId) {
          pNVar14 = pNVar14 + 1;
          goto LAB_0017f060;
        }
        lVar15 = lVar15 + -1;
        pNVar14 = pNVar14 + 4;
      } while (1 < lVar15);
      lVar13 = (long)local_258.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar11;
    }
    lVar13 = (lVar13 >> 5) * -0x5555555555555555;
    if (lVar13 == 1) {
LAB_0017f03a:
      pNVar14 = pNVar11;
      if ((pNVar11->mId).mId != local_218.mId.mId) {
        pNVar14 = local_258.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar13 == 2) {
LAB_0017f032:
      pNVar14 = pNVar11;
      if ((pNVar11->mId).mId != local_218.mId.mId) {
        pNVar11 = pNVar11 + 1;
        goto LAB_0017f03a;
      }
    }
    else {
      if (lVar13 != 3) goto LAB_0017f06c;
      pNVar14 = pNVar11;
      if ((pNVar11->mId).mId != local_218.mId.mId) {
        pNVar11 = pNVar11 + 1;
        goto LAB_0017f032;
      }
    }
LAB_0017f060:
    SVar7 = kRestricted;
    if (pNVar14 !=
        local_258.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0017f181;
  }
LAB_0017f06c:
  pNVar11 = local_258.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_258.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_258.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SVar7 = kSuccess;
  }
  else {
    do {
      local_278.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      BorderRouter::BorderRouter(&local_1b8);
      local_1b8.mNetworkId.mId = (pNVar11->mId).mId;
      iVar9 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&local_1b8,&local_278)
      ;
      pBVar4 = local_278.
               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      cVar8 = (char)iVar9;
      SVar7 = (cVar8 != '\0') << 2;
      if (cVar8 == '\x01') {
        SVar7 = kNotFound;
      }
      bVar17 = true;
      pBVar16 = local_278.
                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (cVar8 == '\0') {
        for (; pBVar16 != pBVar4; pBVar16 = pBVar16 + 1) {
          SVar7 = DeleteBorderRouterById(this,&pBVar16->mId);
          if (SVar7 != kSuccess) goto LAB_0017f14a;
        }
        SVar7 = DropDomainIfEmpty(this,&pNVar11->mDomainId);
        bVar17 = SVar7 != kSuccess;
      }
LAB_0017f14a:
      local_1b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00288f00;
      BorderAgent::~BorderAgent(&local_1b8.mAgent);
      std::
      vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ::~vector(&local_278);
    } while ((!bVar17) && (pNVar11 = pNVar11 + 1, pNVar11 != pNVar5));
  }
LAB_0017f181:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.mMlp._M_dataplus._M_p != &local_218.mMlp.field_2) {
    operator_delete(local_218.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.mName._M_dataplus._M_p != &local_218.mName.field_2) {
    operator_delete(local_218.mName._M_dataplus._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_258);
  return SVar7;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInNetworks(const StringArray &aAliases, StringArray &aUnresolved)
{
    Registry::Status status;
    NetworkArray     nwks;
    Network          current;

    // Check aAliases acceptable
    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_THIS)
        {
            return Registry::Status::kRestricted;
        }
        if (alias == ALIAS_ALL || (alias == ALIAS_OTHER && aAliases.size() > 1))
        {
            return Registry::Status::kDataInvalid;
        }
    }

    VerifyOrExit((status = GetNetworksByAliases(aAliases, nwks, aUnresolved)) == Registry::Status::kSuccess);

    // Processing explicit network aAliases
    if (aAliases[0] != ALIAS_OTHER)
    {
        VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    }

    if (current.mId.mId != EMPTY_ID)
    {
        auto found =
            std::find_if(nwks.begin(), nwks.end(), [&](const Network &a) { return a.mId.mId == current.mId.mId; });
        VerifyOrExit(found == nwks.end(), status = Registry::Status::kRestricted);
    }

    for (const auto &nwk : nwks)
    {
        BorderRouterArray brs;
        BorderRouter      br;

        br.mNetworkId = nwk.mId;
        VerifyOrExit((status = MapStatus(mStorage->Lookup(br, brs))) == Registry::Status::kSuccess);
        for (auto &&br : brs)
        {
            VerifyOrExit((status = DeleteBorderRouterById(br.mId)) == Registry::Status::kSuccess);
        }

        VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
    }
exit:
    return status;
}